

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

bool __thiscall QCalendarPopup::event(QCalendarPopup *this,QEvent *event)

{
  bool bVar1;
  Type TVar2;
  ulong uVar3;
  QEvent *in_RSI;
  long in_RDI;
  QKeyEvent *keyEvent;
  QEvent *in_stack_00000128;
  QWidget *in_stack_00000130;
  
  TVar2 = QEvent::type(in_RSI);
  if ((TVar2 == KeyPress) && (uVar3 = QKeyEvent::matches((StandardKey)in_RSI), (uVar3 & 1) != 0)) {
    *(undefined1 *)(in_RDI + 0x40) = 0;
  }
  bVar1 = QWidget::event(in_stack_00000130,in_stack_00000128);
  return bVar1;
}

Assistant:

bool QCalendarPopup::event(QEvent *event)
{
#if QT_CONFIG(shortcut)
    if (event->type() == QEvent::KeyPress) {
        QKeyEvent *keyEvent = static_cast<QKeyEvent*>(event);
        if (keyEvent->matches(QKeySequence::Cancel))
            dateChanged = false;
    }
#endif
    return QWidget::event(event);
}